

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O0

void __thiscall
CubicInterpolation::interpolation
          (CubicInterpolation *this,PointType *p1,double theta1,PointType *p2,double theta2)

{
  double dVar1;
  RealScalar RVar2;
  double dVar3;
  double dVar4;
  CoeffReturnType CVar5;
  double local_100;
  double local_f8;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_f0;
  double local_d0;
  double local_c8;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_c0;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_90;
  double local_70;
  double ks2;
  double kc2;
  double ks1;
  double kc1;
  double k;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  dp;
  double theta2_local;
  PointType *p2_local;
  double theta1_local;
  PointType *p1_local;
  CubicInterpolation *this_local;
  
  dp._16_8_ = theta2;
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
              *)&k,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)p2,
             (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)p1);
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&k);
  kc1 = RVar2;
  dVar3 = cos(theta1);
  dVar1 = kc1;
  ks1 = RVar2 * dVar3;
  dVar4 = sin(theta1);
  dVar3 = kc1;
  kc2 = dVar1 * dVar4;
  dVar4 = cos((double)dp._16_8_);
  dVar1 = kc1;
  ks2 = dVar3 * dVar4;
  local_70 = sin((double)dp._16_8_);
  local_70 = dVar1 * local_70;
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(this->coeffs_,p1);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_90,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)(this->coeffs_ + 1),&ks1)
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_90,&kc2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_90);
  CVar5 = Eigen::
          DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
                        *)&k,0);
  local_c8 = (CVar5 * 3.0 - (ks1 + ks1)) - ks2;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_c0,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)(this->coeffs_ + 2),
             &local_c8);
  CVar5 = Eigen::
          DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
                        *)&k,1);
  local_d0 = (CVar5 * 3.0 - (kc2 + kc2)) - local_70;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_c0,&local_d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_c0);
  CVar5 = Eigen::
          DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
                        *)&k,0);
  local_f8 = (ks1 - (CVar5 + CVar5)) + ks2;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_f0,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)(this->coeffs_ + 3),
             &local_f8);
  CVar5 = Eigen::
          DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
                        *)&k,1);
  local_100 = (kc2 - (CVar5 + CVar5)) + local_70;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_f0,&local_100);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_f0);
  (**(this->super_Curve<3,_2>)._vptr_Curve)();
  return;
}

Assistant:

void CubicInterpolation::interpolation(const PointType& p1,
                                       double theta1,
                                       const PointType& p2,
                                       double theta2) {
  auto dp = p2 - p1;

  double k = dp.norm();

  double kc1 = k * cos(theta1);
  double ks1 = k * sin(theta1);
  double kc2 = k * cos(theta2);
  double ks2 = k * sin(theta2);

  coeffs_[0] = p1;
  coeffs_[1] << kc1, ks1;
  coeffs_[2] << 3.0 * dp(0) - 2.0 * kc1 - kc2, 3.0 * dp(1) - 2.0 * ks1 - ks2;

  coeffs_[3] << -2.0 * dp(0) + kc1 + kc2, -2.0 * dp(1) + ks1 + ks2;

  computeLength();
}